

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseContent(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  int iVar2;
  
  iVar1 = ctxt->nameNr;
  xmlParseContentInternal(ctxt);
  if ((ctxt->instate != XML_PARSER_EOF) && (iVar2 = ctxt->nameNr, iVar1 < iVar2)) {
    xmlFatalErrMsgStrIntStr
              (ctxt,XML_ERR_TAG_NOT_FINISHED,"Premature end of data in tag %s line %d\n",
               ctxt->nameTab[(long)iVar2 + -1],ctxt->pushTab[(long)iVar2 + -1].line,(xmlChar *)0x0);
    return;
  }
  return;
}

Assistant:

void
xmlParseContent(xmlParserCtxtPtr ctxt) {
    int nameNr = ctxt->nameNr;

    xmlParseContentInternal(ctxt);

    if ((ctxt->instate != XML_PARSER_EOF) && (ctxt->nameNr > nameNr)) {
        const xmlChar *name = ctxt->nameTab[ctxt->nameNr - 1];
        int line = ctxt->pushTab[ctxt->nameNr - 1].line;
        xmlFatalErrMsgStrIntStr(ctxt, XML_ERR_TAG_NOT_FINISHED,
                "Premature end of data in tag %s line %d\n",
		name, line, NULL);
    }
}